

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O1

void libaom_examples::print_multilayer_metadata(MultilayerMetadata *multilayer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pair<libaom_examples::ColorProperties,_bool> *color_properties;
  pair<libaom_examples::ColorProperties,_bool> *color_properties_00;
  pair<libaom_examples::DepthRepresentationElement,_bool> *element;
  pair<libaom_examples::DepthRepresentationElement,_bool> *extraout_RDX;
  pair<libaom_examples::DepthRepresentationElement,_bool> *extraout_RDX_00;
  pair<libaom_examples::DepthRepresentationElement,_bool> *extraout_RDX_01;
  pair<libaom_examples::DepthRepresentationElement,_bool> *extraout_RDX_02;
  pair<libaom_examples::DepthRepresentationElement,_bool> *extraout_RDX_03;
  pair<libaom_examples::DepthRepresentationElement,_bool> *extraout_RDX_04;
  pair<libaom_examples::DepthRepresentationElement,_bool> *ppVar3;
  ulong uVar4;
  long lVar5;
  pointer pLVar6;
  string local_50;
  
  puts("=== Multilayer metadata ===");
  printf("use_case: %d\n",(ulong)multilayer->use_case);
  pLVar6 = (multilayer->layers).
           super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((multilayer->layers).
      super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar6) {
    paVar1 = &local_50.field_2;
    lVar5 = 0x30;
    uVar4 = 0;
    do {
      printf("layer %zu\n",uVar4);
      printf("  layer_type: %d\n",(ulong)*(uint *)((long)pLVar6 + lVar5 + -0x30));
      printf("  luma_plane_only_flag: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0x2c));
      printf("  layer_view_type: %d\n",(ulong)*(uint *)((long)pLVar6 + lVar5 + -0x28));
      printf("  group_id: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0x24));
      printf("  layer_dependency_idc: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0x23));
      printf("  layer_metadata_scope: %d\n",(ulong)*(uint *)((long)pLVar6 + lVar5 + -0x20));
      (anonymous_namespace)::format_color_properties_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)((long)pLVar6 + lVar5 + -0x1c),color_properties)
      ;
      printf("  layer_color_description: %s\n",local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      iVar2 = *(int *)((long)pLVar6 + lVar5 + -0x30);
      if (iVar2 == 6) {
        puts("  depth:");
        (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)((long)&pLVar6->layer_type + lVar5),element);
        printf("    z_near: %s\n",local_50._M_dataplus._M_p);
        ppVar3 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
          ppVar3 = extraout_RDX_00;
        }
        (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(&pLVar6->group_id + lVar5),ppVar3);
        printf("    z_far: %s\n",local_50._M_dataplus._M_p);
        ppVar3 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
          ppVar3 = extraout_RDX_02;
        }
        (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                  (&local_50,
                   (_anonymous_namespace_ *)(&(pLVar6->layer_color_description).second + lVar5),
                   ppVar3);
        printf("    d_min: %s\n",local_50._M_dataplus._M_p);
        ppVar3 = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
          ppVar3 = extraout_RDX_04;
        }
        (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                  (&local_50,
                   (_anonymous_namespace_ *)
                   ((long)&(pLVar6->global_alpha_info).alpha_transparent_value + lVar5),ppVar3);
        printf("    d_max: %s\n",local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        printf("    depth_representation_type: %d\n",
               (ulong)(&(pLVar6->global_depth_info).z_near.first.sign_flag)[lVar5]);
        printf("    disparity_ref_view_id: %d\n",
               (ulong)(&(pLVar6->global_depth_info).z_near.first.exponent)[lVar5]);
        putchar(10);
      }
      else if (iVar2 == 5) {
        puts("  alpha:");
        printf("    alpha_use_idc: %d\n",(ulong)*(uint *)((long)pLVar6 + lVar5 + -0x14));
        printf("    alpha_simple_flag: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0x10));
        if (*(char *)((long)pLVar6 + lVar5 + -0x10) == '\0') {
          printf("    alpha_bit_depth: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0xf));
          printf("    alpha_clip_idc: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0xe));
          printf("    alpha_incr_flag: %d\n",(ulong)*(byte *)((long)pLVar6 + lVar5 + -0xd));
          printf("    alpha_transparent_value: %hu\n",
                 (ulong)*(ushort *)((long)pLVar6 + lVar5 + -0xc));
          printf("    alpha_opaque_value: %hu\n",(ulong)*(ushort *)((long)pLVar6 + lVar5 + -10));
          (anonymous_namespace)::format_color_properties_abi_cxx11_
                    (&local_50,(_anonymous_namespace_ *)((long)pLVar6 + lVar5 + -8),
                     color_properties_00);
          printf("    alpha_color_description: %s\n",local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      uVar4 = uVar4 + 1;
      pLVar6 = (multilayer->layers).
               super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 100;
    } while (uVar4 < (ulong)(((long)(multilayer->layers).
                                    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 2)
                            * -0x70a3d70a3d70a3d7));
  }
  putchar(10);
  return;
}

Assistant:

void print_multilayer_metadata(const MultilayerMetadata &multilayer) {
  printf("=== Multilayer metadata ===\n");
  printf("use_case: %d\n", multilayer.use_case);
  for (size_t i = 0; i < multilayer.layers.size(); ++i) {
    const LayerMetadata &layer = multilayer.layers[i];
    printf("layer %zu\n", i);
    printf("  layer_type: %d\n", layer.layer_type);
    printf("  luma_plane_only_flag: %d\n", layer.luma_plane_only_flag);
    printf("  layer_view_type: %d\n", layer.layer_view_type);
    printf("  group_id: %d\n", layer.group_id);
    printf("  layer_dependency_idc: %d\n", layer.layer_dependency_idc);
    printf("  layer_metadata_scope: %d\n", layer.layer_metadata_scope);
    printf("  layer_color_description: %s\n",
           format_color_properties(layer.layer_color_description).c_str());
    if (layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA) {
      printf("  alpha:\n");
      printf("    alpha_use_idc: %d\n", layer.global_alpha_info.alpha_use_idc);
      printf("    alpha_simple_flag: %d\n",
             layer.global_alpha_info.alpha_simple_flag);
      if (!layer.global_alpha_info.alpha_simple_flag) {
        printf("    alpha_bit_depth: %d\n",
               layer.global_alpha_info.alpha_bit_depth);
        printf("    alpha_clip_idc: %d\n",
               layer.global_alpha_info.alpha_clip_idc);
        printf("    alpha_incr_flag: %d\n",
               layer.global_alpha_info.alpha_incr_flag);
        printf("    alpha_transparent_value: %hu\n",
               layer.global_alpha_info.alpha_transparent_value);
        printf("    alpha_opaque_value: %hu\n",
               layer.global_alpha_info.alpha_opaque_value);
        printf("    alpha_color_description: %s\n",
               format_color_properties(
                   layer.global_alpha_info.alpha_color_description)
                   .c_str());
      }
    } else if (layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH) {
      printf("  depth:\n");
      printf("    z_near: %s\n",
             format_depth_representation_element(layer.global_depth_info.z_near)
                 .c_str());
      printf("    z_far: %s\n",
             format_depth_representation_element(layer.global_depth_info.z_far)
                 .c_str());
      printf("    d_min: %s\n",
             format_depth_representation_element(layer.global_depth_info.d_min)
                 .c_str());
      printf("    d_max: %s\n",
             format_depth_representation_element(layer.global_depth_info.d_max)
                 .c_str());
      printf("    depth_representation_type: %d\n",
             layer.global_depth_info.depth_representation_type);
      printf("    disparity_ref_view_id: %d\n",
             layer.global_depth_info.disparity_ref_view_id);
      printf("\n");
    }
  }
  printf("\n");
}